

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

common_init_result *
common_init_from_params(common_init_result *__return_storage_ptr__,common_params *params)

{
  vector<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
  *this;
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  common_init_result *pcVar4;
  char cVar5;
  int iVar6;
  int32_t iVar7;
  int iVar8;
  uint uVar9;
  pointer __p;
  undefined8 uVar10;
  common_log *pcVar11;
  llama_context *plVar12;
  llama_logit_bias lVar13;
  llama_vocab *vocab;
  long lVar14;
  ulong uVar15;
  pointer pcVar16;
  llama_model_params *plVar17;
  llama_context_params *plVar18;
  undefined8 *puVar19;
  bool bVar20;
  byte bVar21;
  common_control_vector_data cvec;
  llama_token decoder_start_token_id;
  llama_token bos;
  llama_token eos;
  llama_model_params mparams;
  llama_context_params cparams;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined8 local_1f8;
  undefined1 local_1a8 [8];
  llama_logit_bias lStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  int local_188;
  int local_184;
  common_init_result *local_180;
  int local_174;
  undefined8 local_170;
  llama_context *local_168;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined8 local_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined8 local_f8;
  llama_model_params local_f0;
  llama_context_params local_a8;
  
  bVar21 = 0;
  (__return_storage_ptr__->lora).
  super__Vector_base<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->lora).
  super__Vector_base<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->model)._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
  super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
  super__Head_base<0UL,_llama_model_*,_false>._M_head_impl = (llama_model *)0x0;
  (__return_storage_ptr__->context)._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>
  ._M_t.super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
  super__Head_base<0UL,_llama_context_*,_false>._M_head_impl = (llama_context *)0x0;
  (__return_storage_ptr__->lora).
  super__Vector_base<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180 = __return_storage_ptr__;
  common_model_params_to_llama(&local_f0,params);
  pcVar1 = (params->model).path._M_dataplus._M_p;
  plVar17 = &local_f0;
  puVar19 = (undefined8 *)&local_228;
  for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = plVar17->devices;
    plVar17 = (llama_model_params *)((long)plVar17 + ((ulong)bVar21 * -2 + 1) * 8);
    puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
  }
  __p = (pointer)llama_model_load_from_file(pcVar1);
  if (__p == (pointer)0x0) {
    if (common_log_verbosity_thold < 0) {
      return local_180;
    }
    pcVar11 = common_log_main();
    common_log_add(pcVar11,GGML_LOG_LEVEL_ERROR,"%s: failed to load model \'%s\'\n",
                   "common_init_from_params",(params->model).path._M_dataplus._M_p);
    return local_180;
  }
  uVar10 = llama_model_get_vocab(__p);
  if (params->reranking == true) {
    iVar6 = llama_vocab_bos(uVar10);
    bVar20 = iVar6 != -1;
    if ((!bVar20) && (-1 < common_log_verbosity_thold)) {
      pcVar11 = common_log_main();
      common_log_add(pcVar11,GGML_LOG_LEVEL_WARN,
                     "%s: warning: vocab does not have a  BOS token, reranking will not work\n",
                     "common_init_from_params");
    }
    iVar6 = llama_vocab_eos(uVar10);
    if (iVar6 == -1) {
      if (common_log_verbosity_thold < 0) {
        bVar20 = false;
      }
      else {
        pcVar11 = common_log_main();
        bVar20 = false;
        common_log_add(pcVar11,GGML_LOG_LEVEL_WARN,
                       "%s: warning: vocab does not have an EOS token, reranking will not work\n",
                       "common_init_from_params");
      }
    }
    iVar6 = llama_vocab_sep(uVar10);
    if (iVar6 == -1) {
      if (-1 < common_log_verbosity_thold) {
        pcVar11 = common_log_main();
        common_log_add(pcVar11,GGML_LOG_LEVEL_WARN,
                       "%s: warning: vocab does not have a  SEP token, reranking will not work\n",
                       "common_init_from_params");
      }
LAB_001f6d5d:
      llama_model_free(__p);
      return local_180;
    }
    if (!bVar20) goto LAB_001f6d5d;
  }
  local_170 = uVar10;
  common_context_params_to_llama(&local_a8,params);
  plVar18 = &local_a8;
  puVar19 = (undefined8 *)&local_228;
  for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *(undefined8 *)plVar18;
    plVar18 = (llama_context_params *)((long)plVar18 + ((ulong)bVar21 * -2 + 1) * 8);
    puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
  }
  plVar12 = (llama_context *)llama_init_from_model(__p);
  if (plVar12 == (llama_context *)0x0) {
    if (-1 < common_log_verbosity_thold) {
      pcVar11 = common_log_main();
      common_log_add(pcVar11,GGML_LOG_LEVEL_ERROR,"%s: failed to create context with model \'%s\'\n"
                     ,"common_init_from_params",(params->model).path._M_dataplus._M_p);
    }
    llama_model_free(__p);
    return local_180;
  }
  if ((params->ctx_shift == true) && (cVar5 = llama_kv_self_can_shift(plVar12), cVar5 == '\0')) {
    if (-1 < common_log_verbosity_thold) {
      pcVar11 = common_log_main();
      common_log_add(pcVar11,GGML_LOG_LEVEL_WARN,
                     "%s: KV cache shifting is not supported for this context, disabling KV cache shifting\n"
                     ,"common_init_from_params");
    }
    params->ctx_shift = false;
  }
  if ((params->control_vectors).
      super__Vector_base<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (params->control_vectors).
      super__Vector_base<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (params->control_vector_layer_start < 1) {
      params->control_vector_layer_start = 1;
    }
    if (params->control_vector_layer_end < 1) {
      iVar7 = llama_model_n_layer(__p);
      params->control_vector_layer_end = iVar7;
    }
    common_control_vector_load((common_control_vector_data *)local_1a8,&params->control_vectors);
    if (local_1a8._0_4_ == -1) {
      llama_free(plVar12);
      llama_model_free(__p);
LAB_001f6d7a:
      bVar3 = true;
      bVar20 = false;
    }
    else {
      iVar6 = llama_apply_adapter_cvec
                        (plVar12,lStack_1a0,
                         (long)(local_198._M_allocated_capacity - (long)lStack_1a0) >> 2,
                         (ulong)local_1a8 & 0xffffffff,params->control_vector_layer_start,
                         params->control_vector_layer_end);
      if (iVar6 != 0) {
        llama_free(plVar12);
        llama_model_free(__p);
        goto LAB_001f6d7a;
      }
      bVar20 = true;
      bVar3 = false;
    }
    if (lStack_1a0 != (llama_logit_bias)0x0) {
      operator_delete((void *)lStack_1a0,local_198._8_8_ - (long)lStack_1a0);
    }
    pcVar4 = local_180;
    if (!bVar20) {
      if (bVar3) {
        return local_180;
      }
      std::
      vector<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
      ::~vector(&local_180->lora);
      std::unique_ptr<llama_context,_llama_context_deleter>::~unique_ptr(&pcVar4->context);
      std::unique_ptr<llama_model,_llama_model_deleter>::~unique_ptr(&pcVar4->model);
      return local_180;
    }
  }
  pcVar16 = (params->lora_adapters).
            super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (params->lora_adapters).
           super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_168 = plVar12;
  if (pcVar16 != pcVar2) {
    this = &local_180->lora;
    do {
      local_1a8._0_4_ = 0;
      local_1a8._4_4_ = 0.0;
      lVar13 = (llama_logit_bias)llama_adapter_lora_init(__p,(pcVar16->path)._M_dataplus._M_p);
      bVar20 = (llama_logit_bias)local_1a8 != (llama_logit_bias)0x0;
      local_1a8 = (undefined1  [8])lVar13;
      if (bVar20) {
        llama_adapter_lora_free();
      }
      if ((llama_logit_bias)local_1a8 == (llama_logit_bias)0x0) {
        if (-1 < common_log_verbosity_thold) {
          pcVar11 = common_log_main();
          common_log_add(pcVar11,GGML_LOG_LEVEL_ERROR,"%s: failed to apply lora adapter \'%s\'\n",
                         "common_init_from_params",(pcVar16->path)._M_dataplus._M_p);
        }
        llama_free(local_168);
        llama_model_free(__p);
        std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>::~unique_ptr
                  ((unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)local_1a8);
        return local_180;
      }
      pcVar16->ptr = (llama_adapter_lora *)local_1a8;
      std::
      vector<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>,std::allocator<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>>
      ::emplace_back<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>
                ((vector<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>,std::allocator<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>>
                  *)this,(unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)local_1a8);
      std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>::~unique_ptr
                ((unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)local_1a8);
      pcVar16 = pcVar16 + 1;
    } while (pcVar16 != pcVar2);
  }
  plVar12 = local_168;
  if (params->lora_init_without_apply == false) {
    common_set_adapter_lora(local_168,&params->lora_adapters);
  }
  bVar21 = (params->sampling).ignore_eos;
  if ((bool)bVar21 == true) {
    iVar6 = llama_vocab_eos(local_170);
    if (iVar6 == -1) {
      if (-1 < common_log_verbosity_thold) {
        pcVar11 = common_log_main();
        common_log_add(pcVar11,GGML_LOG_LEVEL_WARN,
                       "%s: warning: vocab does not have an EOS token, ignoring --ignore-eos\n",
                       "common_init_from_params");
      }
      (params->sampling).ignore_eos = false;
      goto LAB_001f7044;
    }
    bVar21 = (params->sampling).ignore_eos;
  }
  if ((bVar21 & 1) != 0) {
    for (iVar6 = 0; iVar8 = llama_vocab_n_tokens(local_170), iVar6 < iVar8; iVar6 = iVar6 + 1) {
      cVar5 = llama_vocab_is_eog(local_170,iVar6);
      if (cVar5 != '\0') {
        if (-1 < common_log_verbosity_thold) {
          pcVar11 = common_log_main();
          uVar10 = llama_get_model(plVar12);
          vocab = (llama_vocab *)llama_model_get_vocab(uVar10);
          common_token_to_piece_abi_cxx11_((string *)local_1a8,vocab,iVar6,true);
          common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"%s: added %s logit bias = %f\n",0,
                         "common_init_from_params",local_1a8);
          if (local_1a8 != (undefined1  [8])&local_198) {
            operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
          }
        }
        local_1a8._4_4_ = -INFINITY;
        local_1a8._0_4_ = iVar6;
        std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::
        emplace_back<llama_logit_bias>(&(params->sampling).logit_bias,(llama_logit_bias *)local_1a8)
        ;
      }
    }
  }
LAB_001f7044:
  if ((params->sampling).penalty_last_n == -1) {
    if (-1 < common_log_verbosity_thold) {
      pcVar11 = common_log_main();
      uVar9 = llama_n_ctx(plVar12);
      common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"%s: setting penalty_last_n to ctx_size = %d\n",
                     "common_init_from_params",(ulong)uVar9);
    }
    iVar7 = llama_n_ctx(plVar12);
    (params->sampling).penalty_last_n = iVar7;
  }
  if ((params->sampling).dry_penalty_last_n == -1) {
    if (-1 < common_log_verbosity_thold) {
      pcVar11 = common_log_main();
      uVar9 = llama_n_ctx(plVar12);
      common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"%s: setting dry_penalty_last_n to ctx_size = %d\n"
                     ,"common_init_from_params",(ulong)uVar9);
    }
    iVar7 = llama_n_ctx(plVar12);
    (params->sampling).dry_penalty_last_n = iVar7;
  }
  if (params->warmup == true) {
    if (-1 < common_log_verbosity_thold) {
      pcVar11 = common_log_main();
      common_log_add(pcVar11,GGML_LOG_LEVEL_WARN,
                     "%s: warming up the model with an empty run - please wait ... (--no-warmup to disable)\n"
                     ,"common_init_from_params");
    }
    llama_set_warmup(plVar12,1);
    uVar10 = local_170;
    local_1a8._0_4_ = 0;
    local_1a8._4_4_ = 0.0;
    lStack_1a0.token = 0;
    lStack_1a0.bias = 0.0;
    local_198._M_allocated_capacity = 0;
    local_184 = llama_vocab_bos(local_170);
    local_174 = llama_vocab_eos(uVar10);
    if (local_184 != -1) {
      if (lStack_1a0 == (llama_logit_bias)local_198._M_allocated_capacity) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)local_1a8,(iterator)lStack_1a0,&local_184);
      }
      else {
        *(int *)lStack_1a0 = local_184;
        lStack_1a0 = (llama_logit_bias)((long)lStack_1a0 + 4);
      }
    }
    if (local_174 != -1) {
      if (lStack_1a0 == (llama_logit_bias)local_198._M_allocated_capacity) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)local_1a8,(iterator)lStack_1a0,&local_174);
      }
      else {
        *(int *)lStack_1a0 = local_174;
        lStack_1a0 = (llama_logit_bias)((long)lStack_1a0 + 4);
      }
    }
    if ((llama_logit_bias)local_1a8 == lStack_1a0) {
      local_188 = 0;
      if (local_1a8 == (undefined1  [8])local_198._M_allocated_capacity) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_1a8,(iterator)lStack_1a0,&local_188);
      }
      else {
        *(int *)lStack_1a0 = 0;
        lStack_1a0 = (llama_logit_bias)((long)lStack_1a0 + 4);
      }
    }
    cVar5 = llama_model_has_encoder(__p);
    if (cVar5 != '\0') {
      llama_batch_get_one(&local_128,local_1a8,(ulong)((long)lStack_1a0 - (long)local_1a8) >> 2);
      local_1f8 = local_f8;
      local_208 = local_108;
      uStack_204 = uStack_104;
      uStack_200 = uStack_100;
      uStack_1fc = uStack_fc;
      local_218 = local_118;
      uStack_214 = uStack_114;
      uStack_210 = uStack_110;
      uStack_20c = uStack_10c;
      local_228 = local_128;
      uStack_224 = uStack_124;
      uStack_220 = uStack_120;
      uStack_21c = uStack_11c;
      llama_encode(plVar12);
      local_188 = llama_model_decoder_start_token(__p);
      if (local_188 == -1) {
        local_188 = local_184;
      }
      if (lStack_1a0 != (llama_logit_bias)local_1a8) {
        lStack_1a0.token = local_1a8._0_4_;
        lStack_1a0.bias = (float)local_1a8._4_4_;
      }
      if (lStack_1a0 == (llama_logit_bias)local_198._M_allocated_capacity) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)local_1a8,(iterator)lStack_1a0,&local_188);
      }
      else {
        *(int *)lStack_1a0 = local_188;
        lStack_1a0 = (llama_logit_bias)((long)lStack_1a0 + 4);
      }
    }
    cVar5 = llama_model_has_decoder(__p);
    if (cVar5 != '\0') {
      uVar15 = (long)lStack_1a0 - (long)local_1a8 >> 2;
      if ((ulong)(long)params->n_batch <= uVar15) {
        uVar15 = (long)params->n_batch;
      }
      llama_batch_get_one(&local_160,local_1a8,uVar15);
      local_1f8 = local_130;
      local_208 = local_140;
      uStack_204 = uStack_13c;
      uStack_200 = uStack_138;
      uStack_1fc = uStack_134;
      local_218 = local_150;
      uStack_214 = uStack_14c;
      uStack_210 = uStack_148;
      uStack_20c = uStack_144;
      local_228 = local_160;
      uStack_224 = uStack_15c;
      uStack_220 = uStack_158;
      uStack_21c = uStack_154;
      llama_decode(plVar12);
    }
    llama_kv_self_clear(plVar12);
    llama_synchronize(plVar12);
    llama_perf_context_reset(plVar12);
    llama_set_warmup(plVar12,0);
    if ((llama_logit_bias)local_1a8 != (llama_logit_bias)0x0) {
      operator_delete((void *)local_1a8,local_198._M_allocated_capacity - (long)local_1a8);
    }
  }
  pcVar4 = local_180;
  std::__uniq_ptr_impl<llama_model,_llama_model_deleter>::reset
            ((__uniq_ptr_impl<llama_model,_llama_model_deleter> *)local_180,__p);
  std::__uniq_ptr_impl<llama_context,_llama_context_deleter>::reset
            ((__uniq_ptr_impl<llama_context,_llama_context_deleter> *)&pcVar4->context,plVar12);
  return local_180;
}

Assistant:

struct common_init_result common_init_from_params(common_params & params) {
    common_init_result iparams;
    auto mparams = common_model_params_to_llama(params);

    llama_model * model = llama_model_load_from_file(params.model.path.c_str(), mparams);
    if (model == NULL) {
        LOG_ERR("%s: failed to load model '%s'\n", __func__, params.model.path.c_str());
        return iparams;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    if (params.reranking) {
        bool ok = true;

        if (llama_vocab_bos(vocab) == LLAMA_TOKEN_NULL) {
            LOG_WRN("%s: warning: vocab does not have a  BOS token, reranking will not work\n", __func__);
            ok = false;
        }

        if (llama_vocab_eos(vocab) == LLAMA_TOKEN_NULL) {
            LOG_WRN("%s: warning: vocab does not have an EOS token, reranking will not work\n", __func__);
            ok = false;
        }

        if (llama_vocab_sep(vocab) == LLAMA_TOKEN_NULL) {
            LOG_WRN("%s: warning: vocab does not have a  SEP token, reranking will not work\n", __func__);
            ok = false;
        }

        if (!ok) {
            llama_model_free(model);

            return iparams;
        }
    }

    auto cparams = common_context_params_to_llama(params);

    llama_context * lctx = llama_init_from_model(model, cparams);
    if (lctx == NULL) {
        LOG_ERR("%s: failed to create context with model '%s'\n", __func__, params.model.path.c_str());
        llama_model_free(model);
        return iparams;
    }

    if (params.ctx_shift && !llama_kv_self_can_shift(lctx)) {
        LOG_WRN("%s: KV cache shifting is not supported for this context, disabling KV cache shifting\n", __func__);
        params.ctx_shift = false;
    }

    if (!params.control_vectors.empty()) {
        if (params.control_vector_layer_start <= 0) params.control_vector_layer_start = 1;
        if (params.control_vector_layer_end   <= 0) params.control_vector_layer_end   = llama_model_n_layer(model);

        const auto cvec = common_control_vector_load(params.control_vectors);
        if (cvec.n_embd == -1) {
            llama_free(lctx);
            llama_model_free(model);

            return iparams;
        }

        int err = llama_apply_adapter_cvec(
                lctx,
                cvec.data.data(),
                cvec.data.size(),
                cvec.n_embd,
                params.control_vector_layer_start,
                params.control_vector_layer_end);
        if (err) {
            llama_free(lctx);
            llama_model_free(model);

            return iparams;
        }
    }

    // load and optionally apply lora adapters
    for (auto & la : params.lora_adapters) {
        llama_adapter_lora_ptr lora;
        lora.reset(llama_adapter_lora_init(model, la.path.c_str()));
        if (lora == nullptr) {
            LOG_ERR("%s: failed to apply lora adapter '%s'\n", __func__, la.path.c_str());
            llama_free(lctx);
            llama_model_free(model);
            return iparams;
        }

        la.ptr = lora.get();
        iparams.lora.emplace_back(std::move(lora)); // copy to list of loaded adapters
    }

    if (!params.lora_init_without_apply) {
        common_set_adapter_lora(lctx, params.lora_adapters);
    }

    if (params.sampling.ignore_eos && llama_vocab_eos(vocab) == LLAMA_TOKEN_NULL) {
        LOG_WRN("%s: warning: vocab does not have an EOS token, ignoring --ignore-eos\n", __func__);
        params.sampling.ignore_eos = false;
    }

    if (params.sampling.ignore_eos) {
        for (llama_token i = 0; i < llama_vocab_n_tokens(vocab); i++) {
            if (llama_vocab_is_eog(vocab, i)) {
                LOG_INF("%s: added %s logit bias = %f\n", __func__, common_token_to_piece(lctx, i).c_str(), -INFINITY);
                params.sampling.logit_bias.push_back({i, -INFINITY});
            }
        }
    }

    if (params.sampling.penalty_last_n == -1) {
        LOG_INF("%s: setting penalty_last_n to ctx_size = %d\n", __func__, llama_n_ctx(lctx));
        params.sampling.penalty_last_n = llama_n_ctx(lctx);
    }

    if (params.sampling.dry_penalty_last_n == -1) {
        LOG_INF("%s: setting dry_penalty_last_n to ctx_size = %d\n", __func__, llama_n_ctx(lctx));
        params.sampling.dry_penalty_last_n = llama_n_ctx(lctx);
    }

    if (params.warmup) {
        LOG_WRN("%s: warming up the model with an empty run - please wait ... (--no-warmup to disable)\n", __func__);

        llama_set_warmup(lctx, true);

        std::vector<llama_token> tmp;
        llama_token bos = llama_vocab_bos(vocab);
        llama_token eos = llama_vocab_eos(vocab);

        // some models (e.g. T5) don't have a BOS token
        if (bos != LLAMA_TOKEN_NULL) {
            tmp.push_back(bos);
        }
        if (eos != LLAMA_TOKEN_NULL) {
            tmp.push_back(eos);
        }
        if (tmp.empty()) {
            tmp.push_back(0);
        }

        if (llama_model_has_encoder(model)) {
            llama_encode(lctx, llama_batch_get_one(tmp.data(), tmp.size()));
            llama_token decoder_start_token_id = llama_model_decoder_start_token(model);
            if (decoder_start_token_id == LLAMA_TOKEN_NULL) {
                decoder_start_token_id = bos;
            }
            tmp.clear();
            tmp.push_back(decoder_start_token_id);
        }
        if (llama_model_has_decoder(model)) {
            llama_decode(lctx, llama_batch_get_one(tmp.data(), std::min(tmp.size(), (size_t) params.n_batch)));
        }
        llama_kv_self_clear(lctx);
        llama_synchronize(lctx);
        llama_perf_context_reset(lctx);
        llama_set_warmup(lctx, false);
    }

    iparams.model.reset(model);
    iparams.context.reset(lctx);

    return iparams;
}